

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_SetGlobalVar(JSContext *ctx,JSAtom prop,JSValue val,int flag)

{
  void *pvVar1;
  long lVar2;
  JSStackFrame *pJVar3;
  int iVar4;
  uint uVar5;
  JSValue *pval;
  ulong uVar6;
  
  pvVar1 = (ctx->global_var_obj).u.ptr;
  lVar2 = *(long *)((long)pvVar1 + 0x18);
  uVar5 = *(uint *)(lVar2 + ~(ulong)(*(uint *)(lVar2 + 0x20) & prop) * 4);
  while( true ) {
    if (uVar5 == 0) {
      pJVar3 = ctx->rt->current_stack_frame;
      if ((pJVar3 == (JSStackFrame *)0x0) || (iVar4 = 0x18000, (pJVar3->js_mode & 1U) == 0)) {
        iVar4 = 0x8000;
      }
      iVar4 = JS_SetPropertyInternal(ctx,ctx->global_obj,prop,val,iVar4);
      return iVar4;
    }
    uVar6 = (ulong)uVar5;
    if (*(JSAtom *)(lVar2 + 0x3c + uVar6 * 8) == prop) break;
    uVar5 = *(uint *)(lVar2 + 0x38 + uVar6 * 8) & 0x3ffffff;
  }
  pval = (JSValue *)((uVar6 - 1) * 0x10 + *(long *)((long)pvVar1 + 0x20));
  if (flag != 1) {
    if ((int)pval->tag == 4) {
      JS_FreeValue(ctx,val);
      JS_ThrowReferenceErrorUninitialized(ctx,*(JSAtom *)(lVar2 + 0x3c + uVar6 * 8));
      return -1;
    }
    if ((*(byte *)(lVar2 + 0x3b + uVar6 * 8) & 8) == 0) {
      JS_FreeValue(ctx,val);
      iVar4 = JS_ThrowTypeErrorReadOnly(ctx,0x4000,prop);
      return iVar4;
    }
  }
  set_value(ctx,pval,val);
  return 0;
}

Assistant:

static int JS_SetGlobalVar(JSContext *ctx, JSAtom prop, JSValue val,
                           int flag)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int flags;

    /* no exotic behavior is possible in global_var_obj */
    p = JS_VALUE_GET_OBJ(ctx->global_var_obj);
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* XXX: should handle JS_PROP_AUTOINIT properties? */
        if (flag != 1) {
            if (unlikely(JS_IsUninitialized(pr->u.value))) {
                JS_FreeValue(ctx, val);
                JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                return -1;
            }
            if (unlikely(!(prs->flags & JS_PROP_WRITABLE))) {
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, JS_PROP_THROW, prop);
            }
        }
        set_value(ctx, &pr->u.value, val);
        return 0;
    }
    flags = JS_PROP_THROW_STRICT;
    if (is_strict_mode(ctx)) 
        flags |= JS_PROP_NO_ADD;
    return JS_SetPropertyInternal(ctx, ctx->global_obj, prop, val, flags);
}